

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightLeSample * __thiscall
pbrt::GoniometricLight::SampleLe
          (GoniometricLight *this,Point2f *u1,Point2f *u2,SampledWavelengths *lambda,Float time)

{
  Transform *lambda_00;
  float *pfVar1;
  PiecewiseConstant2D *in_RSI;
  LightLeSample *in_RDI;
  undefined4 in_XMM0_Da;
  double dVar2;
  undefined1 auVar3 [64];
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar8 [56];
  undefined1 auVar7 [64];
  SampledSpectrum SVar9;
  Vector3f VVar10;
  Ray ray;
  Float pdfDir;
  Vector3f wl;
  Float sinTheta;
  Float cosTheta;
  Float phi;
  Float theta;
  Point2f uv;
  Float pdf;
  MediumHandle *pMVar11;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  SampledSpectrum *L;
  LightLeSample *this_00;
  Float in_stack_fffffffffffffed0;
  Float in_stack_fffffffffffffed4;
  float fVar12;
  Float sinTheta_00;
  LightLeSample *pLVar13;
  undefined4 in_stack_ffffffffffffff14;
  Tuple3<pbrt::Vector3,_float> in_stack_ffffffffffffff28;
  MediumHandle local_cc;
  Point3f local_c0 [6];
  Float *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  float fVar14;
  Transform *this_01;
  Tuple2<pbrt::Point2,_float> local_38;
  float local_30;
  undefined4 local_2c;
  undefined1 extraout_var [56];
  
  pLVar13 = in_RDI;
  local_2c = in_XMM0_Da;
  auVar3._0_8_ = PiecewiseConstant2D::Sample(in_RSI,(Point2f *)in_RDI,(Float *)in_RDI);
  sinTheta_00 = SUB84(in_RDI,0);
  auVar3._8_56_ = extraout_var;
  local_38 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar3._0_16_);
  pfVar1 = Tuple2<pbrt::Point2,_float>::operator[](&local_38,1);
  fVar12 = *pfVar1;
  Tuple2<pbrt::Point2,_float>::operator[](&local_38,0);
  std::cos((double)(ulong)(uint)fVar12);
  dVar2 = std::sin((double)(ulong)(uint)fVar12);
  fVar12 = SUB84(dVar2,0);
  auVar6 = (undefined1  [56])0x0;
  VVar10 = SphericalDirection(sinTheta_00,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
  auVar4._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  lambda_00 = (Transform *)vmovlpd_avx(auVar4._0_16_);
  if ((fVar12 != 0.0) || (NAN(fVar12))) {
    fVar12 = local_30 / fVar12;
  }
  else {
    fVar12 = 0.0;
  }
  this_00 = (LightLeSample *)&(in_RSI->pConditionalY).ptr;
  pMVar11 = &local_cc;
  fVar14 = fVar12;
  this_01 = lambda_00;
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (float)((ulong)pMVar11 >> 0x20),SUB84(pMVar11,0),0.0);
  L = (SampledSpectrum *)&stack0xffffffffffffff28;
  MediumHandle::MediumHandle((MediumHandle *)CONCAT44(local_2c,in_stack_fffffffffffffeb0),pMVar11);
  Ray::Ray((Ray *)CONCAT44(fVar12,in_stack_fffffffffffffed0),local_c0,(Vector3f *)this_00,
           (Float)((ulong)L >> 0x20),(MediumHandle *)CONCAT44(local_2c,in_stack_fffffffffffffeb0));
  Transform::operator()
            (this_01,(Ray *)CONCAT44(fVar14,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88);
  auVar6 = ZEXT856(0);
  auVar8 = (undefined1  [56])0x0;
  SVar9 = Scale((GoniometricLight *)
                CONCAT44(in_stack_ffffffffffffff14,VVar10.super_Tuple3<pbrt::Vector3,_float>.z),
                (Vector3f)in_stack_ffffffffffffff28,(SampledWavelengths *)lambda_00);
  auVar7._0_8_ = SVar9.values.values._8_8_;
  auVar7._8_56_ = auVar8;
  auVar5._0_8_ = SVar9.values.values._0_8_;
  auVar5._8_56_ = auVar6;
  vmovlpd_avx(auVar5._0_16_);
  vmovlpd_avx(auVar7._0_16_);
  LightLeSample::LightLeSample
            (this_00,L,(Ray *)CONCAT44(local_2c,in_stack_fffffffffffffeb0),
             (Float)((ulong)pMVar11 >> 0x20),SUB84(pMVar11,0));
  return pLVar13;
}

Assistant:

LightLeSample GoniometricLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                         SampledWavelengths &lambda, Float time) const {
    Float pdf;
    Point2f uv = distrib.Sample(u1, &pdf);
    Float theta = uv[1], phi = uv[0];
    Float cosTheta = std::cos(theta), sinTheta = std::sin(theta);
    Vector3f wl = SphericalDirection(sinTheta, cosTheta, phi);
    Float pdfDir = sinTheta == 0 ? 0 : pdf / sinTheta;

    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.inside));
    return LightLeSample(Scale(wl, lambda), ray, 1, pdfDir);
}